

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feed_info.c
# Opt level: O0

int equal_feed_info(feed_info_t *a,feed_info_t *b)

{
  int iVar1;
  byte local_19;
  feed_info_t *b_local;
  feed_info_t *a_local;
  
  iVar1 = strcmp(a->feed_publisher_name,b->feed_publisher_name);
  local_19 = 0;
  if (iVar1 == 0) {
    iVar1 = strcmp(a->feed_publisher_url,b->feed_publisher_url);
    local_19 = 0;
    if (iVar1 == 0) {
      iVar1 = strcmp(a->feed_lang,b->feed_lang);
      local_19 = 0;
      if (iVar1 == 0) {
        iVar1 = strcmp(a->feed_start_date,b->feed_start_date);
        local_19 = 0;
        if (iVar1 == 0) {
          iVar1 = strcmp(a->feed_end_date,b->feed_end_date);
          local_19 = 0;
          if (iVar1 == 0) {
            iVar1 = strcmp(a->feed_version,b->feed_version);
            local_19 = 0;
            if (iVar1 == 0) {
              iVar1 = strcmp(a->feed_contact_email,b->feed_contact_email);
              local_19 = 0;
              if (iVar1 == 0) {
                iVar1 = strcmp(a->feed_contact_url,b->feed_contact_url);
                local_19 = iVar1 != 0 ^ 0xff;
              }
            }
          }
        }
      }
    }
  }
  return (int)(local_19 & 1);
}

Assistant:

int equal_feed_info(const feed_info_t *a, const feed_info_t *b) {
    return (!strcmp(a->feed_publisher_name, b->feed_publisher_name) &&
             !strcmp(a->feed_publisher_url, b->feed_publisher_url) &&
             !strcmp(a->feed_lang, b->feed_lang) &&
             !strcmp(a->feed_start_date, b->feed_start_date) &&
             !strcmp(a->feed_end_date, b->feed_end_date) &&
             !strcmp(a->feed_version, b->feed_version) &&
             !strcmp(a->feed_contact_email, b->feed_contact_email) &&
             !strcmp(a->feed_contact_url, b->feed_contact_url));
}